

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O2

void __thiscall Flasher::lock(Flasher *this,string *regionArg,bool enable)

{
  Flash *pFVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong *puVar5;
  char *pcVar6;
  reference rVar7;
  bool enable_local;
  Flasher *local_a0;
  vector<bool,_std::allocator<bool>_> regions;
  string sub;
  string local_50 [32];
  
  enable_local = enable;
  if (regionArg->_M_string_length == 0) {
    pcVar6 = "Unlock";
    if (enable) {
      pcVar6 = "Lock";
    }
    (*this->_observer->_vptr_FlasherObserver[2])(this->_observer,"%s all regions\n",pcVar6);
    uVar2 = (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
               super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
               super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[7])();
    std::vector<bool,_std::allocator<bool>_>::vector
              (&regions,(ulong)uVar2,&enable_local,(allocator_type *)&sub);
    pFVar1 = (this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
             super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
    (*pFVar1->_vptr_Flash[0xb])(pFVar1,&regions);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&regions.super__Bvector_base<std::allocator<bool>_>);
  }
  else {
    sub._M_dataplus._M_p = (pointer)&sub.field_2;
    sub._M_string_length = 0;
    sub.field_2._M_local_buf[0] = '\0';
    local_a0 = this;
    (*((this->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t.
       super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
       super__Head_base<0UL,_Flash_*,_false>._M_head_impl)->_vptr_Flash[10])(&regions);
    pcVar6 = "Unlock";
    if (enable) {
      pcVar6 = "Lock";
    }
    do {
      lVar3 = std::__cxx11::string::find((char)regionArg,0x2c);
      std::__cxx11::string::substr((ulong)local_50,(ulong)regionArg);
      std::__cxx11::string::operator=((string *)&sub,local_50);
      std::__cxx11::string::~string(local_50);
      uVar4 = strtol(sub._M_dataplus._M_p,(char **)0x0,0);
      (*local_a0->_observer->_vptr_FlasherObserver[2])
                (local_a0->_observer,"%s region %d\n",pcVar6,uVar4 & 0xffffffff);
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&regions,uVar4 & 0xffffffff);
      puVar5 = rVar7._M_p;
      if (enable) {
        uVar4 = rVar7._M_mask | *puVar5;
      }
      else {
        uVar4 = ~rVar7._M_mask & *puVar5;
      }
      *puVar5 = uVar4;
    } while (lVar3 != -1);
    pFVar1 = (local_a0->_flash->_M_t).super___uniq_ptr_impl<Flash,_std::default_delete<Flash>_>._M_t
             .super__Tuple_impl<0UL,_Flash_*,_std::default_delete<Flash>_>.
             super__Head_base<0UL,_Flash_*,_false>._M_head_impl;
    (*pFVar1->_vptr_Flash[0xb])(pFVar1,&regions);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&regions.super__Bvector_base<std::allocator<bool>_>);
    std::__cxx11::string::~string((string *)&sub);
  }
  return;
}

Assistant:

void
Flasher::lock(string& regionArg, bool enable)
{
    if (regionArg.empty())
    {
        _observer.onStatus("%s all regions\n", enable ? "Lock" : "Unlock");
        std::vector<bool> regions(_flash->lockRegions(), enable);
        _flash->setLockRegions(regions);
    }
    else
    {
        size_t pos = 0;
        size_t delim;
        uint32_t region;
        string sub;
        std::vector<bool> regions = _flash->getLockRegions();

        do
        {
            delim = regionArg.find(',', pos);
            sub = regionArg.substr(pos, delim - pos);
            region = strtol(sub.c_str(), NULL, 0);
            _observer.onStatus("%s region %d\n", enable ? "Lock" : "Unlock", region);
            regions[region] = enable;
            pos = delim + 1;
        } while (delim != string::npos);

        _flash->setLockRegions(regions);
    }
}